

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

ConvexH * ConvexDecomposition::test_cube(void)

{
  undefined8 uVar1;
  float3 *pfVar2;
  Plane *pPVar3;
  HalfEdge *pHVar4;
  ConvexH *this;
  char *__function;
  undefined1 auVar5 [16];
  
  this = (ConvexH *)::operator_new(0x30);
  ConvexH::ConvexH(this,8,0x18,6);
  if (0 < (this->vertices).count) {
    pfVar2 = (this->vertices).element;
    pfVar2->x = 0.0;
    pfVar2->y = 0.0;
    pfVar2->z = 0.0;
    if (1 < (this->vertices).count) {
      pfVar2[1].x = 0.0;
      pfVar2[1].y = 0.0;
      pfVar2[1].z = 1.0;
      if (2 < (this->vertices).count) {
        pfVar2[2].x = 0.0;
        pfVar2[2].y = 1.0;
        pfVar2[2].z = 0.0;
        if (3 < (this->vertices).count) {
          pfVar2[3].x = 0.0;
          pfVar2[3].y = 1.0;
          pfVar2[3].z = 1.0;
          if (4 < (this->vertices).count) {
            uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
            pfVar2[4].x = (float)(int)uVar1;
            pfVar2[4].y = (float)(int)((ulong)uVar1 >> 0x20);
            pfVar2[4].z = 0.0;
            if (5 < (this->vertices).count) {
              uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
              pfVar2[5].x = (float)(int)uVar1;
              pfVar2[5].y = (float)(int)((ulong)uVar1 >> 0x20);
              pfVar2[5].z = 1.0;
              if (6 < (this->vertices).count) {
                auVar5._8_4_ = 0x3f800000;
                auVar5._0_8_ = 0x3f8000003f800000;
                auVar5._12_4_ = 0x3f800000;
                uVar1 = vmovlps_avx(auVar5);
                pfVar2[6].x = (float)(int)uVar1;
                pfVar2[6].y = (float)(int)((ulong)uVar1 >> 0x20);
                pfVar2[6].z = 0.0;
                if (7 < (this->vertices).count) {
                  uVar1 = vmovlps_avx(auVar5);
                  pfVar2[7].x = (float)(int)uVar1;
                  pfVar2[7].y = (float)(int)((ulong)uVar1 >> 0x20);
                  pfVar2[7].z = 1.0;
                  if (0 < (this->facets).count) {
                    pPVar3 = (this->facets).element;
                    *pPVar3 = SUB6416(ZEXT464(0xbf800000),0);
                    if (1 < (this->facets).count) {
                      pPVar3[1].normal.x = 1.0;
                      pPVar3[1].normal.y = 0.0;
                      *(undefined8 *)&pPVar3[1].normal.z = 0xbf80000000000000;
                      if (2 < (this->facets).count) {
                        pPVar3[2].normal.x = 0.0;
                        pPVar3[2].normal.y = -1.0;
                        *(undefined8 *)&pPVar3[2].normal.z = 0;
                        if (3 < (this->facets).count) {
                          pPVar3[3].normal.x = 0.0;
                          pPVar3[3].normal.y = 1.0;
                          *(undefined8 *)&pPVar3[3].normal.z = 0xbf80000000000000;
                          if (4 < (this->facets).count) {
                            pPVar3[4].normal.x = 0.0;
                            pPVar3[4].normal.y = 0.0;
                            *(undefined8 *)&pPVar3[4].normal.z = 0xbf800000;
                            if (5 < (this->facets).count) {
                              pPVar3[5].normal.x = 0.0;
                              pPVar3[5].normal.y = 0.0;
                              *(undefined8 *)&pPVar3[5].normal.z = 0xbf8000003f800000;
                              if ((((((0 < (this->edges).count) &&
                                     (pHVar4 = (this->edges).element, pHVar4->ea = 0xb,
                                     pHVar4->v = '\0', pHVar4->p = '\0', 1 < (this->edges).count))
                                    && (pHVar4 = (this->edges).element, pHVar4[1].ea = 0x17,
                                       pHVar4[1].v = '\x01', pHVar4[1].p = '\0',
                                       2 < (this->edges).count)) &&
                                   (((pHVar4 = (this->edges).element, pHVar4[2].ea = 0xf,
                                     pHVar4[2].v = '\x03', pHVar4[2].p = '\0',
                                     3 < (this->edges).count &&
                                     (pHVar4 = (this->edges).element, pHVar4[3].ea = 0x10,
                                     pHVar4[3].v = '\x02', pHVar4[3].p = '\0',
                                     4 < (this->edges).count)) &&
                                    ((pHVar4 = (this->edges).element, pHVar4[4].ea = 0xd,
                                     pHVar4[4].v = '\x06', pHVar4[4].p = '\x01',
                                     5 < (this->edges).count &&
                                     ((pHVar4 = (this->edges).element, pHVar4[5].ea = 0x15,
                                      pHVar4[5].v = '\a', pHVar4[5].p = '\x01',
                                      6 < (this->edges).count &&
                                      (pHVar4 = (this->edges).element, pHVar4[6].ea = 9,
                                      pHVar4[6].v = '\x05', pHVar4[6].p = '\x01',
                                      7 < (this->edges).count)))))))) &&
                                  (((pHVar4 = (this->edges).element, pHVar4[7].ea = 0x12,
                                    pHVar4[7].v = '\x04', pHVar4[7].p = '\x01',
                                    8 < (this->edges).count &&
                                    ((((((pHVar4 = (this->edges).element, pHVar4[8].ea = 0x13,
                                         pHVar4[8].v = '\0', pHVar4[8].p = '\x02',
                                         9 < (this->edges).count &&
                                         (pHVar4 = (this->edges).element, pHVar4[9].ea = 6,
                                         pHVar4[9].v = '\x04', pHVar4[9].p = '\x02',
                                         10 < (this->edges).count)) &&
                                        (pHVar4 = (this->edges).element, pHVar4[10].ea = 0x14,
                                        pHVar4[10].v = '\x05', pHVar4[10].p = '\x02',
                                        0xb < (this->edges).count)) &&
                                       ((pHVar4 = (this->edges).element, pHVar4[0xb].ea = 0,
                                        pHVar4[0xb].v = '\x01', pHVar4[0xb].p = '\x02',
                                        0xc < (this->edges).count &&
                                        (pHVar4 = (this->edges).element, pHVar4[0xc].ea = 0x16,
                                        pHVar4[0xc].v = '\x03', pHVar4[0xc].p = '\x03',
                                        0xd < (this->edges).count)))) &&
                                      ((pHVar4 = (this->edges).element, pHVar4[0xd].ea = 4,
                                       pHVar4[0xd].v = '\a', pHVar4[0xd].p = '\x03',
                                       0xe < (this->edges).count &&
                                       ((pHVar4 = (this->edges).element, pHVar4[0xe].ea = 0x11,
                                        pHVar4[0xe].v = '\x06', pHVar4[0xe].p = '\x03',
                                        0xf < (this->edges).count &&
                                        (pHVar4 = (this->edges).element, pHVar4[0xf].ea = 2,
                                        pHVar4[0xf].v = '\x02', pHVar4[0xf].p = '\x03',
                                        0x10 < (this->edges).count)))))) &&
                                     (pHVar4 = (this->edges).element, pHVar4[0x10].ea = 3,
                                     pHVar4[0x10].v = '\0', pHVar4[0x10].p = '\x04',
                                     0x11 < (this->edges).count)))) &&
                                   (((pHVar4 = (this->edges).element, pHVar4[0x11].ea = 0xe,
                                     pHVar4[0x11].v = '\x02', pHVar4[0x11].p = '\x04',
                                     0x12 < (this->edges).count &&
                                     (pHVar4 = (this->edges).element, pHVar4[0x12].ea = 7,
                                     pHVar4[0x12].v = '\x06', pHVar4[0x12].p = '\x04',
                                     0x13 < (this->edges).count)) &&
                                    (pHVar4 = (this->edges).element, pHVar4[0x13].ea = 8,
                                    pHVar4[0x13].v = '\x04', pHVar4[0x13].p = '\x04',
                                    0x14 < (this->edges).count)))))) &&
                                 (((pHVar4 = (this->edges).element, pHVar4[0x14].ea = 10,
                                   pHVar4[0x14].v = '\x01', pHVar4[0x14].p = '\x05',
                                   0x15 < (this->edges).count &&
                                   (pHVar4 = (this->edges).element, pHVar4[0x15].ea = 5,
                                   pHVar4[0x15].v = '\x05', pHVar4[0x15].p = '\x05',
                                   0x16 < (this->edges).count)) &&
                                  (pHVar4 = (this->edges).element, pHVar4[0x16].ea = 0xc,
                                  pHVar4[0x16].v = '\a', pHVar4[0x16].p = '\x05',
                                  0x17 < (this->edges).count)))) {
                                pHVar4 = (this->edges).element;
                                pHVar4[0x17].ea = 1;
                                pHVar4[0x17].v = '\x03';
                                pHVar4[0x17].p = '\x05';
                                return this;
                              }
                              __function = 
                              "Type &ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
                              ;
                              goto LAB_00905030;
                            }
                          }
                        }
                      }
                    }
                  }
                  __function = 
                  "Type &ConvexDecomposition::Array<ConvexDecomposition::Plane>::operator[](int) [Type = ConvexDecomposition::Plane]"
                  ;
                  goto LAB_00905030;
                }
              }
            }
          }
        }
      }
    }
  }
  __function = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::float3>::operator[](int) [Type = ConvexDecomposition::float3]"
  ;
LAB_00905030:
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,__function);
}

Assistant:

ConvexH *test_cube() {
	ConvexH *convex = new ConvexH(8,24,6);
	convex->vertices[0] = REAL3(0,0,0);
	convex->vertices[1] = REAL3(0,0,1);
	convex->vertices[2] = REAL3(0,1,0);
	convex->vertices[3] = REAL3(0,1,1);
	convex->vertices[4] = REAL3(1,0,0);
	convex->vertices[5] = REAL3(1,0,1);
	convex->vertices[6] = REAL3(1,1,0);
	convex->vertices[7] = REAL3(1,1,1);

	convex->facets[0] = Plane(REAL3(-1,0,0),0);
	convex->facets[1] = Plane(REAL3(1,0,0),-1);
	convex->facets[2] = Plane(REAL3(0,-1,0),0);
	convex->facets[3] = Plane(REAL3(0,1,0),-1);
	convex->facets[4] = Plane(REAL3(0,0,-1),0);
	convex->facets[5] = Plane(REAL3(0,0,1),-1);

	convex->edges[0 ] = HalfEdge(11,0,0);
	convex->edges[1 ] = HalfEdge(23,1,0);
	convex->edges[2 ] = HalfEdge(15,3,0);
	convex->edges[3 ] = HalfEdge(16,2,0);

	convex->edges[4 ] = HalfEdge(13,6,1);
	convex->edges[5 ] = HalfEdge(21,7,1);
	convex->edges[6 ] = HalfEdge( 9,5,1);
	convex->edges[7 ] = HalfEdge(18,4,1);

	convex->edges[8 ] = HalfEdge(19,0,2);
	convex->edges[9 ] = HalfEdge( 6,4,2);
	convex->edges[10] = HalfEdge(20,5,2);
	convex->edges[11] = HalfEdge( 0,1,2);

	convex->edges[12] = HalfEdge(22,3,3);
	convex->edges[13] = HalfEdge( 4,7,3);
	convex->edges[14] = HalfEdge(17,6,3);
	convex->edges[15] = HalfEdge( 2,2,3);

	convex->edges[16] = HalfEdge( 3,0,4);
	convex->edges[17] = HalfEdge(14,2,4);
	convex->edges[18] = HalfEdge( 7,6,4);
	convex->edges[19] = HalfEdge( 8,4,4);
	
	convex->edges[20] = HalfEdge(10,1,5);
	convex->edges[21] = HalfEdge( 5,5,5);
	convex->edges[22] = HalfEdge(12,7,5);
	convex->edges[23] = HalfEdge( 1,3,5);

	
	return convex;
}